

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertex_list.c
# Opt level: O3

bool_t prf_vertex_list_save_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  ushort uVar1;
  uint8_t *puVar2;
  bool_t bVar3;
  ulong uVar4;
  
  if (node->opcode == prf_vertex_list_info.opcode) {
    bf_put_uint16_be(bfile,node->opcode);
    bf_put_uint16_be(bfile,node->length);
    uVar1 = node->length;
    bVar3 = 1;
    if (7 < uVar1) {
      puVar2 = node->data;
      uVar4 = 0;
      do {
        bf_put_uint32_be(bfile,*(uint32_t *)(puVar2 + uVar4 * 4));
        uVar4 = uVar4 + 1;
      } while ((ushort)(uVar1 - 4) >> 2 != uVar4);
    }
  }
  else {
    bVar3 = 0;
    prf_error(9,"tried vertex list save method on node of type %d.");
  }
  return bVar3;
}

Assistant:

static
bool_t
prf_vertex_list_save_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    uint32_t * ptr;
    int num, count;

    assert( node != NULL && state != NULL && bfile != NULL );

    if ( node->opcode != prf_vertex_list_info.opcode ) {
        prf_error( 9, "tried vertex list save method on node of type %d.",
            node->opcode );
        return FALSE;
    }

    bf_put_uint16_be( bfile, node->opcode );
    bf_put_uint16_be( bfile, node->length );

    ptr = (uint32_t *) node->data;
    num = 0;
    count = (node->length - 4) / 4;
    while ( num < count ) {
        bf_put_uint32_be( bfile, ptr[num] );
        num++;
    }

    return TRUE;
}